

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

string * ApprovalTests::ApprovalTestNamer::convertToFileName
                   (string *__return_storage_ptr__,string *fileName)

{
  pointer pcVar1;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_30[0] = local_20;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + fileName->_M_string_length);
  if (FileNameSanitizerFactory::currentSanitizer_abi_cxx11_._16_8_ != 0) {
    (*(code *)FileNameSanitizerFactory::currentSanitizer_abi_cxx11_._24_8_)
              (__return_storage_ptr__,FileNameSanitizerFactory::currentSanitizer_abi_cxx11_,local_30
              );
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
    return __return_storage_ptr__;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

std::string ApprovalTestNamer::convertToFileName(const std::string& fileName)
    {
        return FileNameSanitizerFactory::currentSanitizer(fileName);
    }